

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void __thiscall
duckdb_parquet::BloomFilterHeader::BloomFilterHeader
          (BloomFilterHeader *this,BloomFilterHeader *other84)

{
  BloomFilterAlgorithm *in_RSI;
  BloomFilterAlgorithm *in_RDI;
  
  duckdb_apache::thrift::TBase::TBase((TBase *)in_RDI);
  *(undefined ***)in_RDI = &PTR__BloomFilterHeader_00c01d70;
  *(undefined ***)in_RDI = &PTR__BloomFilterHeader_00c01d70;
  BloomFilterAlgorithm::BloomFilterAlgorithm(in_RSI);
  BloomFilterHash::BloomFilterHash((BloomFilterHash *)in_RSI);
  BloomFilterCompression::BloomFilterCompression((BloomFilterCompression *)in_RSI);
  *(undefined4 *)&in_RDI->BLOCK = *(undefined4 *)&in_RSI->BLOCK;
  BloomFilterAlgorithm::operator=(in_RSI,in_RDI);
  BloomFilterHash::operator=((BloomFilterHash *)in_RSI,(BloomFilterHash *)in_RDI);
  BloomFilterCompression::operator=
            ((BloomFilterCompression *)in_RSI,(BloomFilterCompression *)in_RDI);
  return;
}

Assistant:

BloomFilterHeader::BloomFilterHeader(const BloomFilterHeader& other84) noexcept {
  numBytes = other84.numBytes;
  algorithm = other84.algorithm;
  hash = other84.hash;
  compression = other84.compression;
}